

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  undefined8 *puVar2;
  bool_t bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bfile_t *bfile;
  prf_model_t *ppVar7;
  FILE *__s;
  int iVar8;
  char *pcVar9;
  char *__format;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar15 [16];
  size_t sStack_70;
  float local_60;
  float local_5c;
  float fStack_58;
  undefined4 local_54;
  prf_model_t *local_50;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  undefined8 uVar14;
  
  if ((argc == 1) || (3 < argc)) {
    pcVar9 = *argv;
    __format = "Usage: %s <flt-file> [<filename.wrl>]\n";
LAB_00103a5e:
    fprintf(_stderr,__format,pcVar9);
  }
  else {
    prf_init();
    bfile = bf_create_r(argv[1]);
    if (bfile == (bfile_t *)0x0) {
      fprintf(_stderr,"Error: Couldn\'t open file named \"%s\".\n",argv[1]);
    }
    else {
      ppVar7 = prf_model_create();
      prf_model_poolmem(ppVar7);
      local_50 = ppVar7;
      bVar3 = prf_model_load(ppVar7,bfile);
      bf_destroy(bfile);
      if (bVar3 == 0) {
        prf_model_destroy(local_50);
        prf_exit();
        pcVar9 = argv[1];
        __format = "Error: Couldn\'t load Open Flight file \"%s\".\n";
        goto LAB_00103a5e;
      }
      __s = _stdout;
      local_44 = argc;
      if ((argc != 3) || (__s = fopen(argv[2],"w"), __s != (FILE *)0x0)) {
        fwrite("#VRML V1.0 ascii\n",0x11,1,__s);
        fwrite("#[generated by flt2vrml v0.2, ",0x1e,1,__s);
        fwrite("http://www.sim.no]\n",0x13,1,__s);
        fwrite("\nSeparator {\n",0xd,1,__s);
        indexarray = array_create_int(4);
        vertexarray = array_create_float(4);
        colorarray = array_create_int(4);
        texcoordarray = array_create_float(4);
        facesets = array_create_ptr(4);
        ppVar7 = local_50;
        currmodel = local_50;
        materialLookup = bsp_create(3);
        ofversion = *(uint16_t *)(ppVar7->header->data + 8);
        prf_model_traverse_io(ppVar7,(prf_cb_t)ZEXT816(0x103a6a));
        lVar10 = 0;
        do {
          iVar4 = array_count(facesets);
          if (iVar4 <= lVar10) {
            fwrite("}\n",2,1,__s);
            array_destroy(indexarray);
            array_destroy(vertexarray);
            array_destroy(colorarray);
            array_destroy(texcoordarray);
            array_destroy(facesets);
            bsp_destroy(materialLookup);
            if (local_44 == 3) {
              fclose(__s);
            }
            prf_model_destroy(local_50);
            prf_exit();
            return 0;
          }
          puVar2 = (undefined8 *)facesets[lVar10];
          local_3c = array_count((void *)puVar2[3]);
          iVar4 = bsp_get_num_points((void *)puVar2[6]);
          array_count((void *)puVar2[4]);
          iVar5 = array_count((void *)puVar2[5]);
          if (*(short *)((long)puVar2 + 0x3c) < 0) {
            bVar11 = false;
          }
          else {
            bVar11 = puVar2[8] != 0;
          }
          if (iVar4 != 0) {
            local_40 = iVar5;
            fwrite("  Separator {\n",0xe,1,__s);
            if (bVar11) {
              fprintf(__s,"  Texture2 {\n    filename \"%s\"\n  }\n",puVar2[8]);
            }
            uVar1 = *(uint *)(puVar2 + 7);
            auVar15._0_4_ = (float)(uVar1 & 0xff00);
            auVar15._4_4_ = (float)(uVar1 & 0xff0000);
            auVar15._8_8_ = 0;
            auVar15 = divps(auVar15,_DAT_00110040);
            uVar14 = auVar15._0_8_;
            fVar13 = (float)(uVar1 & 0xff) / 255.0;
            local_38 = lVar10;
            if ((*(ushort *)((long)puVar2 + 0x4c) | 2) == 3) {
              iVar5 = bsp_get_num_points((void *)*puVar2);
              if (iVar5 < 2) {
                bsp_get_point((void *)*puVar2,0,&local_60);
                uVar14 = CONCAT44(fStack_58,local_5c);
                fVar13 = local_60;
                goto LAB_00103593;
              }
              fprintf(__s,"  Material {\n    ambientColor %g %g %g\n    diffuseColor [\n",
                      (double)*(float *)((long)puVar2 + 100),(double)*(float *)(puVar2 + 0xd),
                      (double)*(float *)((long)puVar2 + 0x6c));
              iVar6 = bsp_get_num_points((void *)*puVar2);
              iVar5 = iVar6 + -1;
              iVar8 = 0;
              if (iVar6 < 1) {
                iVar6 = 0;
                iVar8 = 0;
              }
              for (; iVar6 != iVar8; iVar8 = iVar8 + 1) {
                bsp_get_point((void *)*puVar2,iVar8,&local_60);
                pcVar9 = "      %g %g %g\n";
                if (iVar8 < iVar5) {
                  pcVar9 = "      %g %g %g,\n";
                }
                fprintf(__s,pcVar9,(double)local_60,(double)local_5c,(double)fStack_58);
              }
              fwrite("    ]\n",6,1,__s);
              local_54 = 0;
            }
            else {
LAB_00103593:
              fVar12 = (float)((ulong)uVar14 >> 0x20);
              iVar5 = fprintf(__s,
                              "  Material {\n    diffuseColor %g %g %g\n    ambientColor %g %g %g\n"
                              ,(double)(*(float *)(puVar2 + 0xe) * fVar13),
                              (double)(*(float *)((long)puVar2 + 0x74) * (float)uVar14),
                              (double)(*(float *)(puVar2 + 0xf) * fVar12),
                              (double)(fVar13 * *(float *)((long)puVar2 + 100)),
                              (double)(*(float *)(puVar2 + 0xd) * (float)uVar14),
                              (double)(fVar12 * *(float *)((long)puVar2 + 0x6c)));
              local_54 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),1);
            }
            fVar12 = 1.0 - ((float)*(ushort *)((long)puVar2 + 0x4a) / -65535.0 + 1.0) *
                           *(float *)(puVar2 + 0x13);
            fVar13 = 0.0;
            if ((0.003921569 <= fVar12) && (fVar13 = fVar12, 1.0 < fVar12)) {
              fVar13 = 1.0;
            }
            fprintf(__s,
                    "    specularColor %g %g %g\n    emissiveColor %g %g %g\n    shininess %g\n    transparency %g\n  }\n"
                    ,(double)*(float *)((long)puVar2 + 0x7c),(double)*(float *)(puVar2 + 0x10),
                    (double)*(float *)((long)puVar2 + 0x84),(double)*(float *)(puVar2 + 0x11),
                    (double)*(float *)((long)puVar2 + 0x8c),(double)*(float *)(puVar2 + 0x12),
                    (double)(*(float *)((long)puVar2 + 0x94) * 0.0078125),(double)fVar13);
            fwrite("  Coordinate3 {\n    point [\n",0x1c,1,__s);
            iVar8 = 0;
            iVar5 = iVar4;
            if (iVar4 < 1) {
              iVar5 = iVar8;
            }
            for (; iVar5 != iVar8; iVar8 = iVar8 + 1) {
              bsp_get_point((void *)puVar2[6],iVar8,&local_60);
              pcVar9 = "      %g %g %g\n";
              if (iVar8 < iVar4 + -1) {
                pcVar9 = "      %g %g %g,\n";
              }
              fprintf(__s,pcVar9,(double)local_60,(double)fStack_58,(double)-local_5c);
            }
            fwrite("    ]\n  }\n",10,1,__s);
            iVar4 = bsp_get_num_points((void *)puVar2[1]);
            if (iVar4 != 0) {
              fwrite("  TextureCoordinate2 {\n    point [\n",0x23,1,__s);
              iVar8 = 0;
              iVar5 = iVar4;
              if (iVar4 < 1) {
                iVar5 = iVar8;
              }
              for (; iVar5 != iVar8; iVar8 = iVar8 + 1) {
                bsp_get_point((void *)puVar2[1],iVar8,&local_60);
                pcVar9 = "      %g %g\n";
                if (iVar8 < iVar4 + -1) {
                  pcVar9 = "      %g %g,\n";
                }
                fprintf(__s,pcVar9,(double)local_60,(double)local_5c);
              }
              fwrite("    ]\n  }\n",10,1,__s);
            }
            if (local_3c != 0) {
              if ((char)local_54 == '\0') {
                fwrite("  MaterialBinding {\n    value PER_VERTEX_INDEXED\n  }\n",0x35,1,__s);
                fwrite("  IndexedFaceSet {\n",0x13,1,__s);
                fwrite("    materialIndex [\n      ",0x1a,1,__s);
                print_index_array((FILE *)__s,(int *)puVar2[2]);
                pcVar9 = "    ]\n}\n";
                sStack_70 = 8;
              }
              else {
                pcVar9 = "  IndexedFaceSet {\n";
                sStack_70 = 0x13;
              }
              fwrite(pcVar9,sStack_70,1,__s);
              fwrite("    coordIndex [\n      ",0x17,1,__s);
              print_index_array((FILE *)__s,(int *)puVar2[3]);
              fwrite("    ]\n",6,1,__s);
              if (local_40 != 0) {
                fwrite("    textureCoordIndex [\n      ",0x1e,1,__s);
                print_index_array((FILE *)__s,(int *)puVar2[5]);
                fwrite("    ]\n",6,1,__s);
              }
              fwrite("  }\n",4,1,__s);
            }
            fwrite("  }\n",4,1,__s);
            lVar10 = local_38;
          }
          puVar2 = (undefined8 *)facesets[lVar10];
          bsp_destroy((void *)*puVar2);
          bsp_destroy((void *)puVar2[1]);
          bsp_destroy((void *)puVar2[6]);
          array_destroy((void *)puVar2[3]);
          array_destroy((void *)puVar2[4]);
          array_destroy((void *)puVar2[5]);
          array_destroy((void *)puVar2[2]);
          free(puVar2);
          facesets[lVar10] = (void *)0x0;
          lVar10 = lVar10 + 1;
        } while( true );
      }
      perror("fopen()");
      prf_model_destroy(local_50);
    }
    prf_exit();
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv )
{
  bfile_t * modelfile;
  prf_model_t * model;
  FILE * vrml;

  if ( argc == 1 || argc > 3 ) {
    fprintf( stderr, "Usage: %s <flt-file> [<filename.wrl>]\n", argv[0] );
    return -1;
  }

  prf_init();

  modelfile = bf_create_r( argv[1] );
  if ( ! modelfile ) {
    fprintf( stderr, "Error: Couldn't open file named \"%s\".\n", argv[1] );
    prf_exit();
    return -1;
  }

  model = prf_model_create();
  assert( model != NULL );
  prf_model_poolmem( model );

  if ( ! prf_model_load( model, modelfile ) ) {
    bf_destroy( modelfile );
    prf_model_destroy( model );
    prf_exit();
    fprintf( stderr, "Error: Couldn't load Open Flight file \"%s\".\n",
      argv[1] );
    return -1;
  }
  bf_destroy( modelfile );

  if ( argc == 3 ) {
    vrml = fopen( argv[2], "w" );
    if ( ! vrml ) {
      perror( "fopen()" );
      prf_model_destroy( model );
      prf_exit();
      return -1;
    }
  } else {
    vrml = stdout;
  }

  flt2vrml( model, vrml );

  if ( argc == 3 ) fclose( vrml );
  prf_model_destroy( model );
  prf_exit();
  return 0;
}